

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# injectionmanager.h
# Opt level: O0

shared_ptr<ITest> __thiscall
injection::injection_private::InjectionEngine<ITest>::config
          (InjectionEngine<ITest> *this,function<ITest_*()> *creationFunction,InjectionCommand cmd,
          InjectionScope scope)

{
  bool bVar1;
  int iVar2;
  shared_ptr<ITest> *psVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  shared_ptr<ITest> sVar5;
  undefined1 local_30 [8];
  shared_ptr<ITest> instance;
  InjectionScope scope_local;
  InjectionCommand cmd_local;
  function<ITest_*()> *creationFunction_local;
  
  instance.super___shared_ptr<ITest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = scope;
  instance.super___shared_ptr<ITest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = cmd;
  if ((config(std::function<ITest*()>,injection::injection_private::InjectionCommand,injection::InjectionScope)
       ::maker == '\0') &&
     (iVar2 = __cxa_guard_acquire(&config(std::function<ITest*()>,injection::injection_private::InjectionCommand,injection::InjectionScope)
                                   ::maker), iVar2 != 0)) {
    std::function<ITest_*()>::function(&config::maker);
    __cxa_atexit(std::function<ITest_*()>::~function,&config::maker,&__dso_handle);
    __cxa_guard_release(&config(std::function<ITest*()>,injection::injection_private::InjectionCommand,injection::InjectionScope)
                         ::maker);
  }
  if ((config(std::function<ITest*()>,injection::injection_private::InjectionCommand,injection::InjectionScope)
       ::shared == '\0') &&
     (iVar2 = __cxa_guard_acquire(&config(std::function<ITest*()>,injection::injection_private::InjectionCommand,injection::InjectionScope)
                                   ::shared), iVar2 != 0)) {
    __cxa_atexit(std::shared_ptr<ITest>::~shared_ptr,&config::shared,&__dso_handle);
    __cxa_guard_release(&config(std::function<ITest*()>,injection::injection_private::InjectionCommand,injection::InjectionScope)
                         ::shared);
  }
  if (instance.super___shared_ptr<ITest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ == SET)
  {
    config::scopeType =
         (InjectionScope)
         instance.super___shared_ptr<ITest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    std::function<ITest_*()>::operator=(&config::maker,creationFunction);
    if ((InjectionScope)
        instance.super___shared_ptr<ITest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
        SINGLETON_EAGER) {
      set(&config::shared,&config::maker);
    }
    else {
      std::__shared_ptr<ITest,_(__gnu_cxx::_Lock_policy)2>::reset
                (&config::shared.super___shared_ptr<ITest,_(__gnu_cxx::_Lock_policy)2>);
    }
  }
  else if (instance.super___shared_ptr<ITest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ ==
           GET) {
    if (config::scopeType == TRANSIENT) {
      std::shared_ptr<ITest>::shared_ptr((shared_ptr<ITest> *)local_30);
      psVar3 = set((shared_ptr<ITest> *)local_30,&config::maker);
      std::shared_ptr<ITest>::shared_ptr((shared_ptr<ITest> *)this,psVar3);
      std::shared_ptr<ITest>::~shared_ptr((shared_ptr<ITest> *)local_30);
      _Var4._M_pi = extraout_RDX_02;
    }
    else if (config::scopeType == SINGLETON) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&config::shared);
      if (bVar1) {
        std::shared_ptr<ITest>::shared_ptr((shared_ptr<ITest> *)this,&config::shared);
        _Var4._M_pi = extraout_RDX_00;
      }
      else {
        psVar3 = set(&config::shared,&config::maker);
        std::shared_ptr<ITest>::shared_ptr((shared_ptr<ITest> *)this,psVar3);
        _Var4._M_pi = extraout_RDX_01;
      }
    }
    else if (config::scopeType == SINGLETON_EAGER) {
      std::shared_ptr<ITest>::shared_ptr((shared_ptr<ITest> *)this,&config::shared);
      _Var4._M_pi = extraout_RDX;
    }
    else {
      std::shared_ptr<ITest>::shared_ptr((shared_ptr<ITest> *)this);
      _Var4._M_pi = extraout_RDX_03;
    }
    goto LAB_001186d1;
  }
  std::shared_ptr<ITest>::shared_ptr((shared_ptr<ITest> *)this,&config::shared);
  _Var4._M_pi = extraout_RDX_04;
LAB_001186d1:
  sVar5.super___shared_ptr<ITest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi;
  sVar5.super___shared_ptr<ITest,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<ITest>)sVar5.super___shared_ptr<ITest,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<I> config(std::function<I*(void)> creationFunction, InjectionCommand cmd, InjectionScope scope = InjectionScope::INVALID) {

        static std::function<I*(void)> maker;
        static InjectionScope scopeType = InjectionScope::INVALID;
        static std::shared_ptr<I> shared;

        switch(cmd) {
            case InjectionCommand::SET:
                scopeType = scope;
                maker = creationFunction;
                if (scope == InjectionScope::SINGLETON_EAGER) {
                    set(shared, maker);
                } else {
                    shared.reset();
                }

                break;
            case InjectionCommand::GET:
                switch(scopeType) {
                    case InjectionScope::SINGLETON_EAGER:
                        return shared;
                    case InjectionScope::SINGLETON:
                        if (shared) {
                            return shared;
                        }
                    return set(shared, maker);

                case InjectionScope::TRANSIENT: {
                        std::shared_ptr<I> instance;
                        return set(instance, maker);
                    }
                default:
                        return std::shared_ptr<I>();
                }

        }
        return shared;
    }